

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

value_type *
phmap::priv::NodeHashMapPolicy<std::__cxx11::string,int>::
new_element<phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<>>
          (Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           *alloc,piecewise_construct_t *args,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_1,tuple<> *args_2)

{
  pointer ppVar1;
  PairAlloc pair_alloc;
  
  pair_alloc.id_ = alloc->id_;
  ppVar1 = allocator_traits<phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::allocate(&pair_alloc,1);
  std::pair<std::__cxx11::string_const,int>::pair<std::__cxx11::string_const&>
            ((pair<std::__cxx11::string_const,int> *)ppVar1);
  return ppVar1;
}

Assistant:

static value_type* new_element(Allocator* alloc, Args&&... args) {
        using PairAlloc = typename phmap::allocator_traits<
            Allocator>::template rebind_alloc<value_type>;
        PairAlloc pair_alloc(*alloc);
        value_type* res =
            phmap::allocator_traits<PairAlloc>::allocate(pair_alloc, 1);
        phmap::allocator_traits<PairAlloc>::construct(pair_alloc, res,
                                                      std::forward<Args>(args)...);
        return res;
    }